

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::Shape
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  int iVar1;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar2;
  int i;
  long lVar3;
  int ic;
  ulong uVar4;
  TPZShapeData data;
  TPZVec<long> local_39f0;
  long alStack_39d0 [8];
  TPZVec<int> local_3990;
  int aiStack_3970 [20];
  TPZShapeData local_3920;
  
  TPZShapeData::TPZShapeData(&local_3920);
  TPZVec<long>::TPZVec(&local_39f0,0);
  local_39f0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  local_39f0.fNElements = 8;
  local_39f0.fNAlloc = 0;
  alStack_39d0[0] = 0;
  alStack_39d0[1] = 0;
  alStack_39d0[2] = 0;
  alStack_39d0[3] = 0;
  alStack_39d0[4] = 0;
  alStack_39d0[5] = 0;
  alStack_39d0[6] = 0;
  alStack_39d0[7] = 0;
  local_39f0.fStore = alStack_39d0;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar3 = 0;
  do {
    pTVar2 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    local_39f0.fStore[lVar3] = (long)pTVar2->fId;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  TPZVec<int>::TPZVec(&local_3990,0);
  local_3990._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdca8;
  local_3990.fNElements = 0x13;
  local_3990.fNAlloc = 0;
  aiStack_3970[0] = 0;
  aiStack_3970[1] = 0;
  aiStack_3970[2] = 0;
  aiStack_3970[3] = 0;
  aiStack_3970[4] = 0;
  aiStack_3970[5] = 0;
  aiStack_3970[6] = 0;
  aiStack_3970[7] = 0;
  aiStack_3970[8] = 0;
  aiStack_3970[9] = 0;
  aiStack_3970[10] = 0;
  aiStack_3970[0xb] = 0;
  aiStack_3970[0xc] = 0;
  aiStack_3970[0xd] = 0;
  aiStack_3970[0xe] = 0;
  aiStack_3970[0xf] = 0;
  aiStack_3970[0x10] = 0;
  aiStack_3970[0x11] = 0;
  aiStack_3970[0x12] = 0;
  uVar4 = 0;
  local_3990.fStore = aiStack_3970;
  do {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x3c0))(this,uVar4 & 0xffffffff);
    local_3990.fStore[uVar4] = iVar1;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x13);
  TPZShapeHCurl<pzshape::TPZShapeCube>::Initialize(&local_39f0,&local_3990,&local_3920);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,3,(long)iVar1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,3,(long)iVar1);
  TPZShapeHCurl<pzshape::TPZShapeCube>::Shape(pt,&local_3920,phi,dphi);
  if (local_3990.fStore != aiStack_3970) {
    local_3990.fNAlloc = 0;
    local_3990._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_3990.fStore != (int *)0x0) {
      operator_delete__(local_3990.fStore);
    }
  }
  if (local_39f0.fStore != alStack_39d0) {
    local_39f0.fNAlloc = 0;
    local_39f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_39f0.fStore != (long *)0x0) {
      operator_delete__(local_39f0.fStore);
    }
  }
  TPZShapeData::~TPZShapeData(&local_3920,&TPZShapeData::VTT);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
    //this method is not really useful right now
    TPZShapeData data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    constexpr auto nConnects{TSHAPE::NSides-TSHAPE::NCornerNodes};
    TPZManVector<int, nConnects> conorders(nConnects,0);

    for(int ic = 0; ic < nConnects; ic++){
        conorders[ic] = this->ConnectOrder(ic);
    }

    TPZShapeHCurl<TSHAPE>::Initialize(ids,conorders,data);
    const auto nShape = this->NShapeF();

    constexpr int dim = TSHAPE::Dimension;

    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    phi.Redim(dim,nShape);
    dphi.Redim(curldim, nShape);
    
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi, dphi);
}